

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_rc2_test.c
# Opt level: O0

float calc_ssim(pixel *pix1,RK_U32 stride1,pixel *pix2,RK_U32 stride2,int width,int height,void *buf
               ,int *cnt)

{
  void *pvVar1;
  int iVar2;
  float fVar3;
  int local_6c;
  void *SWAP_tmp;
  int (*sum1) [4];
  int (*sum0) [4];
  int local_38;
  float ssim;
  int z;
  int y;
  int x;
  int height_local;
  int width_local;
  RK_U32 stride2_local;
  pixel *pix2_local;
  RK_U32 stride1_local;
  pixel *pix1_local;
  
  local_38 = 0;
  sum0._4_4_ = 0.0;
  sum1 = (int (*) [4])buf;
  iVar2 = width >> 2;
  SWAP_tmp = (void *)((long)buf + (long)iVar2 * 0x10 + 0x30);
  for (ssim = 1.4013e-45; (int)ssim < height >> 2; ssim = (float)((int)ssim + 1)) {
    for (; pvVar1 = SWAP_tmp, local_38 <= (int)ssim; local_38 = local_38 + 1) {
      SWAP_tmp = sum1;
      sum1 = (int (*) [4])pvVar1;
      for (z = 0; z < iVar2; z = z + 2) {
        ssim_4x4x2_core(pix1 + (z + local_38 * stride1) * 4,(ulong)stride1,
                        pix2 + (z + local_38 * stride2) * 4,(ulong)stride2,
                        (int (*) [4])((long)pvVar1 + (long)z * 0x10));
      }
    }
    for (z = 0; z < iVar2 + -1; z = z + 4) {
      if ((iVar2 - z) + -1 < 4) {
        local_6c = (iVar2 - z) + -1;
      }
      else {
        local_6c = 4;
      }
      fVar3 = ssim_end4(sum1 + z,(int (*) [4])((long)SWAP_tmp + (long)z * 0x10),local_6c);
      sum0._4_4_ = fVar3 + sum0._4_4_;
    }
  }
  *cnt = ((height >> 2) + -1) * (iVar2 + -1);
  return sum0._4_4_;
}

Assistant:

static float calc_ssim(pixel *pix1, RK_U32 stride1,
                       pixel *pix2, RK_U32 stride2,
                       int width, int height, void *buf, int *cnt)
{
    int x = 0;
    int y = 0;
    int z = 0;
    float ssim = 0.0;
    int (*sum0)[4] = buf;
    int (*sum1)[4] = sum0 + (width >> 2) + 3;

    width >>= 2;
    height >>= 2;
    for ( y = 1; y < height; y++  ) {
        for ( ; z <= y; z++  ) {
            MPP_SWAP( void*, sum0, sum1  );
            for ( x = 0; x < width; x += 2  )
                ssim_4x4x2_core(&pix1[4 * (x + z * stride1)],
                                stride1, &pix2[4 * (x + z * stride2)],
                                stride2, &sum0[x]  );
        }
        for ( x = 0; x < width - 1; x += 4  )
            ssim += ssim_end4(sum0 + x, sum1 + x,
                              MPP_MIN(4, width - x - 1));

    }
    *cnt = (height - 1) * (width - 1);
    return ssim;
}